

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O1

boolean throwing_weapon(obj *obj)

{
  bool bVar1;
  
  if ((((byte)(obj->oclass | 4U) != 6) ||
      (bVar1 = true, 2 < (byte)(objects[obj->otyp].oc_subtyp + 0x1bU))) &&
     ((obj->oclass != 2 ||
      ((bVar1 = true, (objects[obj->otyp].oc_subtyp & 0xfeU) != 0x12 &&
       (((byte)(objects[obj->otyp].oc_subtyp - 5U) < 0xfc ||
        ((objects[obj->otyp].field_0x11 & 4) == 0)))))))) {
    bVar1 = true;
    if (obj->otyp != 0x3b) {
      bVar1 = obj->otyp == 0x3f;
    }
  }
  return bVar1;
}

Assistant:

boolean throwing_weapon(const struct obj *obj)
{
	return (is_missile(obj) || is_spear(obj) ||
		/* daggers and knife (excludes scalpel) */
		(is_blade(obj) && !is_sword(obj) &&
		 (objects[obj->otyp].oc_dir & PIERCE)) ||
		/* special cases [might want to add AXE] */
		obj->otyp == WAR_HAMMER || obj->otyp == AKLYS);
}